

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O0

void amrex::MLABecLaplacian::FFlux
               (Box *box,Real *dxinv,Real bscalar,Array<const_FArrayBox_*,_3> *bcoef,
               Array<FArrayBox_*,_3> *flux,FArrayBox *sol,int face_only,int ncomp)

{
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  const_reference ppFVar5;
  const_reference ppFVar6;
  IntVect *pIVar7;
  double *in_RSI;
  Box *in_RDI;
  long in_R8;
  int in_R9D;
  double in_XMM0_Qa;
  int in_stack_00000008;
  Box tbox_5;
  iterator __end3_5;
  iterator __begin3_5;
  range_impl<amrex::Box> *__range3_5;
  Box bx_3;
  Box tbox_4;
  iterator __end3_4;
  iterator __begin3_4;
  range_impl<amrex::Box> *__range3_4;
  Box bx_2;
  Box tbox_3;
  iterator __end3_3;
  iterator __begin3_3;
  range_impl<amrex::Box> *__range3_3;
  Box bflux;
  Real fac_1;
  Box tbox_2;
  iterator __end3_2;
  iterator __begin3_2;
  range_impl<amrex::Box> *__range3_2;
  Box tbox_1;
  iterator __end3_1;
  iterator __begin3_1;
  range_impl<amrex::Box> *__range3_1;
  Box tbox;
  iterator __end3;
  iterator __begin3;
  range_impl<amrex::Box> *__range3;
  int blen;
  Box blo;
  Real fac;
  Array4<const_double> *solarr;
  Array4<double> *fzarr;
  Array4<double> *fyarr;
  Array4<double> *fxarr;
  Array4<const_double> bz;
  Array4<const_double> by;
  Array4<const_double> bx;
  IndexType typ_2;
  int sm_2;
  IntVect hi_4;
  IntVect low_2;
  IndexType typ_1;
  int sm_1;
  IntVect hi_2;
  IntVect low_1;
  IndexType typ;
  int sm;
  IntVect hi;
  IntVect low;
  int i;
  int j;
  int k;
  int n;
  Dim3 hi_1;
  Dim3 lo;
  int i_2;
  int i_1;
  int j_1;
  int k_1;
  int n_1;
  Dim3 hi_3;
  Dim3 lo_1;
  int i_4;
  int j_3;
  int i_3;
  int j_2;
  int k_2;
  int n_2;
  Dim3 hi_5;
  Dim3 lo_2;
  int i_5;
  int j_4;
  int k_3;
  int n_3;
  Dim3 hi_6;
  Dim3 lo_3;
  int i_6;
  int j_5;
  int k_4;
  int n_4;
  Dim3 hi_7;
  Dim3 lo_4;
  int i_7;
  int j_6;
  int k_5;
  int n_5;
  Dim3 hi_8;
  Dim3 lo_5;
  size_type in_stack_ffffffffffffe5e8;
  range_impl<amrex::Box> *in_stack_ffffffffffffe5f0;
  Box *__return_storage_ptr__;
  Box local_1994;
  iterator local_1978;
  iterator local_1960;
  undefined1 local_1948 [40];
  undefined1 *local_1920;
  undefined8 local_1918;
  undefined8 local_1910;
  undefined8 local_1908;
  uint local_1900;
  Box local_18fc;
  iterator local_18e0;
  iterator local_18c8;
  undefined1 local_18b0 [40];
  undefined1 *local_1888;
  undefined8 local_1880;
  undefined8 local_1878;
  undefined8 local_1870;
  uint local_1868;
  Box local_1864;
  iterator local_1848;
  iterator local_1830;
  undefined1 local_1818 [40];
  undefined1 *local_17f0;
  undefined8 local_17e4;
  undefined8 local_17dc;
  undefined8 local_17d4;
  uint local_17cc;
  double local_17c8;
  Box local_17bc;
  iterator local_17a0;
  iterator local_1788;
  undefined1 local_1770 [40];
  undefined1 *local_1748;
  Box local_1740;
  Box local_1724;
  iterator local_1708;
  iterator local_16f0;
  undefined1 local_16d8 [40];
  undefined1 *local_16b0;
  Box local_16a8;
  Box local_168c;
  iterator local_1670;
  iterator local_1658;
  undefined1 local_1640 [40];
  undefined1 *local_1618;
  int local_1610;
  Box local_160c;
  double local_15f0;
  Array4<const_double> local_15e8;
  Array4<const_double> *local_15a8;
  Array4<double> local_15a0;
  Array4<double> *local_1560;
  Array4<double> local_1558;
  Array4<double> *local_1518;
  Array4<double> local_1510;
  Array4<double> *local_14d0;
  Array4<const_double> local_14c8;
  Array4<const_double> local_1488;
  Array4<const_double> local_1448;
  int local_1404;
  long local_1400;
  double local_13e8;
  double *local_13e0;
  Box *local_13d8;
  value_type local_13d0;
  value_type local_13c8;
  value_type local_13c0;
  value_type local_13b8;
  value_type local_13b0;
  value_type local_13a8;
  long local_13a0;
  uint local_1394;
  uint local_1390;
  int local_138c;
  IntVect local_1388;
  IntVect local_137c;
  int local_1370;
  int local_136c;
  Box *local_1368;
  uint local_135c;
  uint local_1358;
  int local_1354;
  IntVect local_1350;
  IntVect local_1344;
  int local_1338;
  int local_1334;
  Box *local_1330;
  uint local_1324;
  uint local_1320;
  int local_131c;
  IntVect local_1318;
  IntVect local_130c;
  int local_1300;
  int local_12fc;
  Box *local_12f8;
  int local_12f0;
  int local_12ec;
  int local_12e8;
  int local_12e4;
  int local_12a0;
  int local_129c;
  double local_1298;
  Array4<const_double> *local_1290;
  Array4<const_double> *local_1288;
  Array4<double> *local_1280;
  Box *local_1278;
  Box *local_1260;
  Box *local_1238;
  int local_1220;
  int local_121c;
  int local_1218;
  int local_1214;
  Array4<const_double> *local_1210;
  int local_1208;
  int local_1204;
  int local_1200;
  int local_11fc;
  Array4<const_double> *local_11f8;
  int local_11f0;
  int local_11ec;
  int local_11e8;
  int local_11e4;
  Array4<const_double> *local_11e0;
  int local_11d8;
  int local_11d4;
  int local_11d0;
  int local_11cc;
  Array4<const_double> *local_11c8;
  int local_11c0;
  int local_11bc;
  int local_11b8;
  Array4<const_double> *local_11b0;
  int local_11a8;
  int local_11a4;
  int local_11a0;
  Array4<const_double> *local_1198;
  int local_1190;
  int local_118c;
  int local_1188;
  int local_1184;
  Array4<double> *local_1180;
  int local_1178;
  int local_1174;
  int local_1170;
  Array4<double> *local_1168;
  int local_115c;
  int local_1158;
  int local_1154;
  int local_1150;
  int local_114c;
  int local_1108;
  int local_1104;
  double local_1100;
  Array4<const_double> *local_10f8;
  Array4<const_double> *local_10f0;
  Array4<double> *local_10e8;
  Box *local_10e0;
  Box *local_10c8;
  Box *local_10a0;
  int local_1088;
  int local_1084;
  int local_1080;
  int local_107c;
  Array4<const_double> *local_1078;
  int local_1070;
  int local_106c;
  int local_1068;
  int local_1064;
  Array4<const_double> *local_1060;
  int local_1058;
  int local_1054;
  int local_1050;
  int local_104c;
  Array4<const_double> *local_1048;
  int local_1040;
  int local_103c;
  int local_1038;
  int local_1034;
  Array4<const_double> *local_1030;
  int local_1028;
  int local_1024;
  int local_101c;
  Array4<const_double> *local_1018;
  int local_1010;
  int local_100c;
  int local_1004;
  Array4<const_double> *local_1000;
  int local_ff8;
  int local_ff4;
  int local_ff0;
  int local_fec;
  Array4<double> *local_fe8;
  int local_fe0;
  int local_fdc;
  int local_fd4;
  Array4<double> *local_fd0;
  int local_fc8;
  int local_fc4;
  int local_fc0;
  int local_fbc;
  int local_fb8;
  int local_fb4;
  int local_f70;
  int local_f6c;
  double local_f68;
  Array4<const_double> *local_f60;
  Array4<const_double> *local_f58;
  Array4<double> *local_f50;
  Box *local_f48;
  Box *local_f30;
  Box *local_f08;
  int local_ef0;
  int local_eec;
  int local_ee8;
  int local_ee4;
  Array4<const_double> *local_ee0;
  int local_ed8;
  int local_ed4;
  int local_ed0;
  int local_ecc;
  Array4<const_double> *local_ec8;
  int local_ec0;
  int local_ebc;
  int local_eb8;
  int local_eb4;
  Array4<const_double> *local_eb0;
  int local_ea8;
  int local_ea4;
  int local_ea0;
  int local_e9c;
  Array4<const_double> *local_e98;
  int local_e90;
  int local_e88;
  int local_e84;
  Array4<const_double> *local_e80;
  int local_e78;
  int local_e70;
  int local_e6c;
  Array4<const_double> *local_e68;
  int local_e60;
  int local_e5c;
  int local_e58;
  int local_e54;
  Array4<double> *local_e50;
  int local_e48;
  int local_e40;
  int local_e3c;
  Array4<double> *local_e38;
  undefined4 local_e2c;
  Box *local_e28;
  undefined4 local_e1c;
  Box *local_e18;
  undefined4 local_e0c;
  Box *local_e08;
  int local_e00;
  int local_dfc;
  int local_df8;
  int local_df4;
  int local_db4;
  double local_db0;
  Array4<const_double> *local_da8;
  Array4<const_double> *local_da0;
  Array4<double> *local_d98;
  Box *local_d90;
  Box *local_d78;
  Box *local_d50;
  int local_d38;
  int local_d34;
  int local_d30;
  int local_d2c;
  Array4<const_double> *local_d28;
  int local_d20;
  int local_d1c;
  int local_d18;
  int local_d14;
  Array4<const_double> *local_d10;
  int local_d08;
  int local_d04;
  int local_d00;
  int local_cfc;
  Array4<const_double> *local_cf8;
  int local_cf0;
  int local_cec;
  int local_ce8;
  int local_ce4;
  Array4<double> *local_ce0;
  int local_cd8;
  int local_cd4;
  int local_cd0;
  int local_ccc;
  int local_c8c;
  double local_c88;
  Array4<const_double> *local_c80;
  Array4<const_double> *local_c78;
  Array4<double> *local_c70;
  Box *local_c68;
  Box *local_c50;
  Box *local_c28;
  int local_c10;
  int local_c0c;
  int local_c08;
  int local_c04;
  Array4<const_double> *local_c00;
  int local_bf8;
  int local_bf4;
  int local_bf0;
  int local_bec;
  Array4<const_double> *local_be8;
  int local_be0;
  int local_bdc;
  int local_bd8;
  int local_bd4;
  Array4<const_double> *local_bd0;
  int local_bc8;
  int local_bc4;
  int local_bc0;
  int local_bbc;
  Array4<double> *local_bb8;
  int local_bb0;
  int local_bac;
  int local_ba8;
  int local_ba4;
  undefined8 local_ba0;
  int local_b98;
  undefined8 local_b8c;
  int local_b84;
  undefined8 local_b80;
  int local_b78;
  undefined8 local_b70;
  int local_b68;
  int local_b64;
  double local_b60;
  Array4<const_double> *local_b58;
  Array4<const_double> *local_b50;
  Array4<double> *local_b48;
  Box *local_b40;
  undefined8 local_b38;
  int local_b30;
  Box *local_b28;
  int local_b1c;
  int iStack_b18;
  int local_b14;
  undefined8 local_b10;
  int local_b08;
  Box *local_b00;
  int local_af4;
  int iStack_af0;
  int local_aec;
  int local_ae8;
  int local_ae4;
  int local_ae0;
  int local_adc;
  Array4<const_double> *local_ad8;
  int local_ad0;
  int local_acc;
  int local_ac8;
  int local_ac4;
  Array4<const_double> *local_ac0;
  int local_ab8;
  int local_ab4;
  int local_ab0;
  int local_aac;
  Array4<const_double> *local_aa8;
  int local_aa0;
  int local_a9c;
  int local_a98;
  int local_a94;
  Array4<double> *local_a90;
  int local_a84;
  uint *local_a80;
  int local_a78;
  int local_a74;
  uint *local_a70;
  int local_a68;
  int local_a64;
  uint *local_a60;
  int local_a58;
  int local_a54;
  IntVect *local_a50;
  int local_a44;
  IntVect *local_a40;
  int local_a34;
  IntVect *local_a30;
  undefined4 local_a24;
  IntVect *local_a20;
  undefined4 local_a14;
  IntVect *local_a10;
  undefined4 local_a04;
  IntVect *local_a00;
  undefined4 local_9f4;
  Box *local_9f0;
  undefined4 local_9e4;
  Box *local_9e0;
  undefined4 local_9d4;
  Box *local_9d0;
  undefined4 local_9c4;
  IntVect *local_9c0;
  undefined4 local_9b4;
  IntVect *local_9b0;
  undefined4 local_9a4;
  IntVect *local_9a0;
  undefined4 local_994;
  Box *local_990;
  undefined4 local_984;
  Box *local_980;
  undefined4 local_974;
  Box *local_970;
  undefined4 local_964;
  IntVect *local_960;
  undefined4 local_954;
  IntVect *local_950;
  undefined4 local_944;
  IntVect *local_940;
  undefined4 local_934;
  Box *local_930;
  undefined4 local_924;
  Box *local_920;
  undefined4 local_914;
  Box *local_910;
  undefined4 local_904;
  IntVect *local_900;
  undefined4 local_8f4;
  IntVect *local_8f0;
  undefined4 local_8e4;
  IntVect *local_8e0;
  undefined4 local_8d4;
  Box *local_8d0;
  undefined4 local_8c4;
  Box *local_8c0;
  undefined4 local_8b4;
  Box *local_8b0;
  undefined4 local_8a4;
  IntVect *local_8a0;
  undefined4 local_894;
  IntVect *local_890;
  undefined4 local_884;
  IntVect *local_880;
  undefined4 local_874;
  Box *local_870;
  undefined4 local_864;
  Box *local_860;
  undefined4 local_854;
  Box *local_850;
  undefined4 local_844;
  IntVect *local_840;
  undefined4 local_834;
  IntVect *local_830;
  undefined4 local_824;
  IntVect *local_820;
  undefined4 local_814;
  Box *local_810;
  undefined4 local_804;
  Box *local_800;
  undefined4 local_7f4;
  Box *local_7f0;
  int local_7e8;
  int local_7e4;
  IntVect *local_7e0;
  int local_7d8;
  int local_7d4;
  IntVect *local_7d0;
  int local_7c8;
  int local_7c4;
  IntVect *local_7c0;
  int local_7b8;
  int local_7b4;
  IntVect *local_7b0;
  int local_7a8;
  int local_7a4;
  IntVect *local_7a0;
  int local_798;
  int local_794;
  IntVect *local_790;
  undefined4 local_784;
  undefined8 *local_780;
  undefined4 local_774;
  uint *local_770;
  undefined4 local_768;
  undefined4 local_764;
  long local_760;
  undefined4 local_754;
  uint *local_750;
  undefined4 local_748;
  undefined4 local_744;
  uint *local_740;
  undefined4 local_738;
  undefined4 local_734;
  undefined8 *local_730;
  undefined4 local_724;
  uint *local_720;
  undefined4 local_718;
  undefined4 local_714;
  long local_710;
  undefined4 local_704;
  uint *local_700;
  undefined4 local_6f8;
  undefined4 local_6f4;
  uint *local_6f0;
  undefined4 local_6e8;
  undefined4 local_6e4;
  undefined8 *local_6e0;
  undefined4 local_6d4;
  uint *local_6d0;
  undefined4 local_6c8;
  undefined4 local_6c4;
  long local_6c0;
  undefined4 local_6b4;
  uint *local_6b0;
  undefined4 local_6a8;
  undefined4 local_6a4;
  uint *local_6a0;
  undefined4 local_694;
  Dim3 local_690;
  Dim3 local_67c;
  Dim3 local_670;
  Dim3 local_660;
  int local_654;
  undefined8 *local_650;
  double *local_648;
  Dim3 local_640;
  undefined8 *local_630;
  undefined4 local_628;
  undefined4 uStack_624;
  int local_620;
  undefined4 local_61c;
  undefined8 *local_618;
  undefined4 local_60c;
  undefined8 *local_608;
  undefined4 local_5fc;
  undefined8 *local_5f8;
  Dim3 local_5f0;
  undefined8 *local_5e0;
  int local_5d8;
  int iStack_5d4;
  int local_5d0;
  undefined4 local_5cc;
  long local_5c8;
  undefined4 local_5bc;
  long local_5b8;
  undefined4 local_5ac;
  int *local_5a8;
  Dim3 local_5a0;
  Dim3 local_590;
  Dim3 local_580;
  Dim3 local_570;
  int local_564;
  Box *local_560;
  double *local_558;
  Dim3 local_550;
  Box *local_540;
  int local_538;
  int iStack_534;
  int local_530;
  undefined4 local_52c;
  Box *local_528;
  undefined4 local_51c;
  Box *local_518;
  undefined4 local_50c;
  Box *local_508;
  Dim3 local_500;
  Box *local_4f0;
  int local_4e8;
  int iStack_4e4;
  int local_4e0;
  undefined4 local_4dc;
  IntVect *local_4d8;
  undefined4 local_4cc;
  IntVect *local_4c8;
  undefined4 local_4bc;
  IntVect *local_4b8;
  Dim3 local_4b0;
  Dim3 local_4a0;
  Dim3 local_490;
  Dim3 local_480;
  int local_474;
  Box *local_470;
  double *local_468;
  Dim3 local_460;
  Box *local_450;
  int local_448;
  int iStack_444;
  int local_440;
  undefined4 local_43c;
  Box *local_438;
  undefined4 local_42c;
  Box *local_428;
  undefined4 local_41c;
  Box *local_418;
  Dim3 local_410;
  Box *local_400;
  int local_3f8;
  int iStack_3f4;
  int local_3f0;
  undefined4 local_3ec;
  IntVect *local_3e8;
  undefined4 local_3dc;
  IntVect *local_3d8;
  undefined4 local_3cc;
  IntVect *local_3c8;
  Dim3 local_3c0;
  Dim3 local_3b0;
  Dim3 local_3a0;
  Dim3 local_390;
  int local_384;
  Box *local_380;
  double *local_378;
  Dim3 local_370;
  Box *local_360;
  int local_358;
  int iStack_354;
  int local_350;
  undefined4 local_34c;
  Box *local_348;
  undefined4 local_33c;
  Box *local_338;
  undefined4 local_32c;
  Box *local_328;
  Dim3 local_320;
  Box *local_310;
  int local_308;
  int iStack_304;
  int local_300;
  undefined4 local_2fc;
  IntVect *local_2f8;
  undefined4 local_2ec;
  IntVect *local_2e8;
  undefined4 local_2dc;
  IntVect *local_2d8;
  Dim3 local_2d0;
  Dim3 local_2c0;
  Dim3 local_2b0;
  Dim3 local_2a0;
  int local_294;
  Box *local_290;
  double *local_288;
  Dim3 local_280;
  Box *local_270;
  int local_268;
  int iStack_264;
  int local_260;
  undefined4 local_25c;
  Box *local_258;
  undefined4 local_24c;
  Box *local_248;
  undefined4 local_23c;
  Box *local_238;
  Dim3 local_230;
  Box *local_220;
  int local_218;
  int iStack_214;
  int local_210;
  undefined4 local_20c;
  IntVect *local_208;
  undefined4 local_1fc;
  IntVect *local_1f8;
  undefined4 local_1ec;
  IntVect *local_1e8;
  Dim3 local_1e0;
  Dim3 local_1d0;
  Dim3 local_1c0;
  Dim3 local_1b0;
  int local_1a4;
  Box *local_1a0;
  double *local_198;
  Dim3 local_190;
  Box *local_180;
  int local_178;
  int iStack_174;
  int local_170;
  undefined4 local_16c;
  Box *local_168;
  undefined4 local_15c;
  Box *local_158;
  undefined4 local_14c;
  Box *local_148;
  Dim3 local_140;
  Box *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  IntVect *local_118;
  undefined4 local_10c;
  IntVect *local_108;
  undefined4 local_fc;
  IntVect *local_f8;
  Dim3 local_f0;
  Dim3 local_e0;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  Box *local_b0;
  double *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_1404 = in_R9D;
  local_1400 = in_R8;
  local_13e8 = in_XMM0_Qa;
  local_13e0 = in_RSI;
  local_13d8 = in_RDI;
  ppFVar5 = std::array<const_amrex::FArrayBox_*,_3UL>::operator[]
                      ((array<const_amrex::FArrayBox_*,_3UL> *)in_stack_ffffffffffffe5f0,
                       in_stack_ffffffffffffe5e8);
  local_13c0 = *ppFVar5;
  local_558 = (local_13c0->super_BaseFab<double>).dptr;
  local_560 = &(local_13c0->super_BaseFab<double>).domain;
  local_564 = (local_13c0->super_BaseFab<double>).nvar;
  local_50c = 0;
  local_538 = (local_560->smallend).vect[0];
  local_51c = 1;
  iStack_534 = (local_13c0->super_BaseFab<double>).domain.smallend.vect[1];
  local_580.x = (local_560->smallend).vect[0];
  local_580.y = (local_560->smallend).vect[1];
  local_52c = 2;
  local_580.z = (local_13c0->super_BaseFab<double>).domain.smallend.vect[2];
  local_4b8 = &(local_13c0->super_BaseFab<double>).domain.bigend;
  local_4bc = 0;
  local_4e8 = local_4b8->vect[0] + 1;
  local_4c8 = &(local_13c0->super_BaseFab<double>).domain.bigend;
  local_4cc = 1;
  iStack_4e4 = (local_13c0->super_BaseFab<double>).domain.bigend.vect[1] + 1;
  local_4d8 = &(local_13c0->super_BaseFab<double>).domain.bigend;
  local_4dc = 2;
  local_5a0.z = (local_13c0->super_BaseFab<double>).domain.bigend.vect[2] + 1;
  local_5a0.y = iStack_4e4;
  local_5a0.x = local_4e8;
  local_590._0_8_ = local_5a0._0_8_;
  local_590.z = local_5a0.z;
  local_570._0_8_ = local_580._0_8_;
  local_570.z = local_580.z;
  local_550._0_8_ = local_580._0_8_;
  local_550.z = local_580.z;
  local_540 = local_560;
  local_530 = local_580.z;
  local_528 = local_560;
  local_518 = local_560;
  local_508 = local_560;
  local_500._0_8_ = local_5a0._0_8_;
  local_500.z = local_5a0.z;
  local_4f0 = local_560;
  local_4e0 = local_5a0.z;
  Array4<const_double>::Array4(&local_1448,local_558,&local_570,&local_590,local_564);
  ppFVar5 = std::array<const_amrex::FArrayBox_*,_3UL>::operator[]
                      ((array<const_amrex::FArrayBox_*,_3UL> *)in_stack_ffffffffffffe5f0,
                       in_stack_ffffffffffffe5e8);
  local_13c8 = *ppFVar5;
  local_468 = (local_13c8->super_BaseFab<double>).dptr;
  local_470 = &(local_13c8->super_BaseFab<double>).domain;
  local_474 = (local_13c8->super_BaseFab<double>).nvar;
  local_41c = 0;
  local_448 = (local_470->smallend).vect[0];
  local_42c = 1;
  iStack_444 = (local_13c8->super_BaseFab<double>).domain.smallend.vect[1];
  local_490.x = (local_470->smallend).vect[0];
  local_490.y = (local_470->smallend).vect[1];
  local_43c = 2;
  local_490.z = (local_13c8->super_BaseFab<double>).domain.smallend.vect[2];
  local_3c8 = &(local_13c8->super_BaseFab<double>).domain.bigend;
  local_3cc = 0;
  local_3f8 = local_3c8->vect[0] + 1;
  local_3d8 = &(local_13c8->super_BaseFab<double>).domain.bigend;
  local_3dc = 1;
  iStack_3f4 = (local_13c8->super_BaseFab<double>).domain.bigend.vect[1] + 1;
  local_3e8 = &(local_13c8->super_BaseFab<double>).domain.bigend;
  local_3ec = 2;
  local_4b0.z = (local_13c8->super_BaseFab<double>).domain.bigend.vect[2] + 1;
  local_4b0.y = iStack_3f4;
  local_4b0.x = local_3f8;
  local_4a0._0_8_ = local_4b0._0_8_;
  local_4a0.z = local_4b0.z;
  local_480._0_8_ = local_490._0_8_;
  local_480.z = local_490.z;
  local_460._0_8_ = local_490._0_8_;
  local_460.z = local_490.z;
  local_450 = local_470;
  local_440 = local_490.z;
  local_438 = local_470;
  local_428 = local_470;
  local_418 = local_470;
  local_410._0_8_ = local_4b0._0_8_;
  local_410.z = local_4b0.z;
  local_400 = local_470;
  local_3f0 = local_4b0.z;
  Array4<const_double>::Array4(&local_1488,local_468,&local_480,&local_4a0,local_474);
  ppFVar5 = std::array<const_amrex::FArrayBox_*,_3UL>::operator[]
                      ((array<const_amrex::FArrayBox_*,_3UL> *)in_stack_ffffffffffffe5f0,
                       in_stack_ffffffffffffe5e8);
  local_13d0 = *ppFVar5;
  local_378 = (local_13d0->super_BaseFab<double>).dptr;
  local_380 = &(local_13d0->super_BaseFab<double>).domain;
  local_384 = (local_13d0->super_BaseFab<double>).nvar;
  local_32c = 0;
  local_358 = (local_380->smallend).vect[0];
  local_33c = 1;
  iStack_354 = (local_13d0->super_BaseFab<double>).domain.smallend.vect[1];
  local_3a0.x = (local_380->smallend).vect[0];
  local_3a0.y = (local_380->smallend).vect[1];
  local_34c = 2;
  local_3a0.z = (local_13d0->super_BaseFab<double>).domain.smallend.vect[2];
  local_2d8 = &(local_13d0->super_BaseFab<double>).domain.bigend;
  local_2dc = 0;
  local_308 = local_2d8->vect[0] + 1;
  local_2e8 = &(local_13d0->super_BaseFab<double>).domain.bigend;
  local_2ec = 1;
  iStack_304 = (local_13d0->super_BaseFab<double>).domain.bigend.vect[1] + 1;
  local_2f8 = &(local_13d0->super_BaseFab<double>).domain.bigend;
  local_2fc = 2;
  local_3c0.z = (local_13d0->super_BaseFab<double>).domain.bigend.vect[2] + 1;
  local_3c0.y = iStack_304;
  local_3c0.x = local_308;
  local_3b0._0_8_ = local_3c0._0_8_;
  local_3b0.z = local_3c0.z;
  local_390._0_8_ = local_3a0._0_8_;
  local_390.z = local_3a0.z;
  local_370._0_8_ = local_3a0._0_8_;
  local_370.z = local_3a0.z;
  local_360 = local_380;
  local_350 = local_3a0.z;
  local_348 = local_380;
  local_338 = local_380;
  local_328 = local_380;
  local_320._0_8_ = local_3c0._0_8_;
  local_320.z = local_3c0.z;
  local_310 = local_380;
  local_300 = local_3c0.z;
  Array4<const_double>::Array4(&local_14c8,local_378,&local_390,&local_3b0,local_384);
  ppFVar6 = std::array<amrex::FArrayBox_*,_3UL>::operator[]
                      ((array<amrex::FArrayBox_*,_3UL> *)in_stack_ffffffffffffe5f0,
                       in_stack_ffffffffffffe5e8);
  local_13a8 = *ppFVar6;
  local_288 = (local_13a8->super_BaseFab<double>).dptr;
  local_290 = &(local_13a8->super_BaseFab<double>).domain;
  local_294 = (local_13a8->super_BaseFab<double>).nvar;
  local_23c = 0;
  local_268 = (local_290->smallend).vect[0];
  local_24c = 1;
  iStack_264 = (local_13a8->super_BaseFab<double>).domain.smallend.vect[1];
  local_2b0.x = (local_290->smallend).vect[0];
  local_2b0.y = (local_290->smallend).vect[1];
  local_25c = 2;
  local_2b0.z = (local_13a8->super_BaseFab<double>).domain.smallend.vect[2];
  local_1e8 = &(local_13a8->super_BaseFab<double>).domain.bigend;
  local_1ec = 0;
  local_218 = local_1e8->vect[0] + 1;
  local_1f8 = &(local_13a8->super_BaseFab<double>).domain.bigend;
  local_1fc = 1;
  iStack_214 = (local_13a8->super_BaseFab<double>).domain.bigend.vect[1] + 1;
  local_208 = &(local_13a8->super_BaseFab<double>).domain.bigend;
  local_20c = 2;
  local_2d0.z = (local_13a8->super_BaseFab<double>).domain.bigend.vect[2] + 1;
  local_2d0.y = iStack_214;
  local_2d0.x = local_218;
  local_2c0._0_8_ = local_2d0._0_8_;
  local_2c0.z = local_2d0.z;
  local_2a0._0_8_ = local_2b0._0_8_;
  local_2a0.z = local_2b0.z;
  local_280._0_8_ = local_2b0._0_8_;
  local_280.z = local_2b0.z;
  local_270 = local_290;
  local_260 = local_2b0.z;
  local_258 = local_290;
  local_248 = local_290;
  local_238 = local_290;
  local_230._0_8_ = local_2d0._0_8_;
  local_230.z = local_2d0.z;
  local_220 = local_290;
  local_210 = local_2d0.z;
  Array4<double>::Array4(&local_1510,local_288,&local_2a0,&local_2c0,local_294);
  local_14d0 = &local_1510;
  ppFVar6 = std::array<amrex::FArrayBox_*,_3UL>::operator[]
                      ((array<amrex::FArrayBox_*,_3UL> *)in_stack_ffffffffffffe5f0,
                       in_stack_ffffffffffffe5e8);
  local_13b0 = *ppFVar6;
  local_198 = (local_13b0->super_BaseFab<double>).dptr;
  local_1a0 = &(local_13b0->super_BaseFab<double>).domain;
  local_1a4 = (local_13b0->super_BaseFab<double>).nvar;
  local_14c = 0;
  local_178 = (local_1a0->smallend).vect[0];
  local_15c = 1;
  iStack_174 = (local_13b0->super_BaseFab<double>).domain.smallend.vect[1];
  local_1c0.x = (local_1a0->smallend).vect[0];
  local_1c0.y = (local_1a0->smallend).vect[1];
  local_16c = 2;
  local_1c0.z = (local_13b0->super_BaseFab<double>).domain.smallend.vect[2];
  local_f8 = &(local_13b0->super_BaseFab<double>).domain.bigend;
  local_fc = 0;
  local_128 = local_f8->vect[0] + 1;
  local_108 = &(local_13b0->super_BaseFab<double>).domain.bigend;
  local_10c = 1;
  iStack_124 = (local_13b0->super_BaseFab<double>).domain.bigend.vect[1] + 1;
  local_118 = &(local_13b0->super_BaseFab<double>).domain.bigend;
  local_11c = 2;
  local_1e0.z = (local_13b0->super_BaseFab<double>).domain.bigend.vect[2] + 1;
  local_1e0.y = iStack_124;
  local_1e0.x = local_128;
  local_1d0._0_8_ = local_1e0._0_8_;
  local_1d0.z = local_1e0.z;
  local_1b0._0_8_ = local_1c0._0_8_;
  local_1b0.z = local_1c0.z;
  local_190._0_8_ = local_1c0._0_8_;
  local_190.z = local_1c0.z;
  local_180 = local_1a0;
  local_170 = local_1c0.z;
  local_168 = local_1a0;
  local_158 = local_1a0;
  local_148 = local_1a0;
  local_140._0_8_ = local_1e0._0_8_;
  local_140.z = local_1e0.z;
  local_130 = local_1a0;
  local_120 = local_1e0.z;
  Array4<double>::Array4(&local_1558,local_198,&local_1b0,&local_1d0,local_1a4);
  local_1518 = &local_1558;
  ppFVar6 = std::array<amrex::FArrayBox_*,_3UL>::operator[]
                      ((array<amrex::FArrayBox_*,_3UL> *)in_stack_ffffffffffffe5f0,
                       in_stack_ffffffffffffe5e8);
  local_13b8 = *ppFVar6;
  local_a8 = (local_13b8->super_BaseFab<double>).dptr;
  local_b0 = &(local_13b8->super_BaseFab<double>).domain;
  local_b4 = (local_13b8->super_BaseFab<double>).nvar;
  local_5c = 0;
  local_88 = (local_b0->smallend).vect[0];
  local_6c = 1;
  iStack_84 = (local_13b8->super_BaseFab<double>).domain.smallend.vect[1];
  local_d0.x = (local_b0->smallend).vect[0];
  local_d0.y = (local_b0->smallend).vect[1];
  local_7c = 2;
  local_d0.z = (local_13b8->super_BaseFab<double>).domain.smallend.vect[2];
  local_8 = &(local_13b8->super_BaseFab<double>).domain.bigend;
  local_c = 0;
  local_38 = local_8->vect[0] + 1;
  local_18 = &(local_13b8->super_BaseFab<double>).domain.bigend;
  local_1c = 1;
  iStack_34 = (local_13b8->super_BaseFab<double>).domain.bigend.vect[1] + 1;
  local_28 = &(local_13b8->super_BaseFab<double>).domain.bigend;
  local_2c = 2;
  local_f0.z = (local_13b8->super_BaseFab<double>).domain.bigend.vect[2] + 1;
  local_f0.y = iStack_34;
  local_f0.x = local_38;
  local_e0._0_8_ = local_f0._0_8_;
  local_e0.z = local_f0.z;
  local_c0._0_8_ = local_d0._0_8_;
  local_c0.z = local_d0.z;
  local_a0._0_8_ = local_d0._0_8_;
  local_a0.z = local_d0.z;
  local_90 = local_b0;
  local_80 = local_d0.z;
  local_78 = local_b0;
  local_68 = local_b0;
  local_58 = local_b0;
  local_50._0_8_ = local_f0._0_8_;
  local_50.z = local_f0.z;
  local_40 = local_b0;
  local_30 = local_f0.z;
  Array4<double>::Array4(&local_15a0,local_a8,&local_c0,&local_e0,local_b4);
  local_13a0 = local_1400;
  local_648 = *(double **)(local_1400 + 0x10);
  local_650 = (undefined8 *)(local_1400 + 0x18);
  local_654 = *(int *)(local_1400 + 0x34);
  local_5fc = 0;
  local_628 = *(undefined4 *)local_650;
  local_60c = 1;
  uStack_624 = *(undefined4 *)(local_1400 + 0x1c);
  local_670._0_8_ = *local_650;
  local_61c = 2;
  local_670.z = *(int *)(local_1400 + 0x20);
  local_5a8 = (int *)(local_1400 + 0x24);
  local_5ac = 0;
  local_5d8 = *local_5a8 + 1;
  local_5b8 = local_1400 + 0x24;
  local_5bc = 1;
  iStack_5d4 = *(int *)(local_1400 + 0x28) + 1;
  local_5c8 = local_1400 + 0x24;
  local_5cc = 2;
  local_690.z = *(int *)(local_1400 + 0x2c) + 1;
  local_690.y = iStack_5d4;
  local_690.x = local_5d8;
  local_1560 = &local_15a0;
  local_67c._0_8_ = local_690._0_8_;
  local_67c.z = local_690.z;
  local_660._0_8_ = local_670._0_8_;
  local_660.z = local_670.z;
  local_640._0_8_ = local_670._0_8_;
  local_640.z = local_670.z;
  local_630 = local_650;
  local_620 = local_670.z;
  local_618 = local_650;
  local_608 = local_650;
  local_5f8 = local_650;
  local_5f0._0_8_ = local_690._0_8_;
  local_5f0.z = local_690.z;
  local_5e0 = local_650;
  local_5d0 = local_690.z;
  Array4<const_double>::Array4(&local_15e8,local_648,&local_660,&local_67c,local_654);
  local_15a8 = &local_15e8;
  if (local_1404 == 0) {
    local_17c8 = local_13e8 * *local_13e0;
    local_e08 = local_13d8;
    local_e0c = 0;
    local_17e4 = *(undefined8 *)(local_13d8->smallend).vect;
    local_17dc = *(undefined8 *)((local_13d8->smallend).vect + 2);
    local_17d4 = *(undefined8 *)((local_13d8->bigend).vect + 1);
    local_17cc = (local_13d8->btype).itype;
    local_780 = &local_17e4;
    local_784 = 0;
    local_770 = &local_17cc;
    local_774 = 0;
    local_754 = 0;
    local_748 = 0;
    if ((local_17cc & 1) == 0) {
      local_760 = (long)&local_17dc + 4;
      local_764 = 0;
      local_768 = 1;
      local_740 = &local_17cc;
      local_744 = 0;
      local_738 = 0;
      local_17cc = local_17cc | 1;
    }
    local_750 = local_770;
    Gpu::Range<amrex::Box>(&in_stack_ffffffffffffe5f0->m_b);
    local_17f0 = local_1818;
    Gpu::range_detail::range_impl<amrex::Box>::begin(in_stack_ffffffffffffe5f0);
    Gpu::range_detail::range_impl<amrex::Box>::end(in_stack_ffffffffffffe5f0);
    while (bVar3 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                             (&local_1830,&local_1848), bVar3) {
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_1864,&local_1830);
      local_d98 = local_14d0;
      local_da0 = local_15a8;
      local_da8 = &local_1448;
      local_db0 = local_17c8;
      local_db4 = in_stack_00000008;
      local_914 = 0;
      local_924 = 1;
      local_934 = 2;
      local_940 = &local_1864.bigend;
      local_944 = 0;
      local_950 = &local_1864.bigend;
      local_954 = 1;
      local_960 = &local_1864.bigend;
      local_964 = 2;
      for (local_df4 = 0; iVar1 = local_1864.smallend.vect[2], local_df4 < in_stack_00000008;
          local_df4 = local_df4 + 1) {
        while (local_df8 = iVar1, iVar1 = local_1864.smallend.vect[1],
              local_df8 <= local_1864.bigend.vect[2]) {
          while (local_dfc = iVar1, iVar1 = local_1864.smallend.vect[0],
                local_dfc <= local_1864.bigend.vect[1]) {
            while (local_e00 = iVar1, local_e00 <= local_1864.bigend.vect[0]) {
              local_cfc = local_e00;
              local_d00 = local_dfc;
              local_d04 = local_df8;
              local_d08 = local_df4;
              local_d10 = local_15a8;
              local_d14 = local_e00;
              local_d18 = local_dfc;
              local_d1c = local_df8;
              local_d20 = local_df4;
              local_d28 = local_15a8;
              local_d2c = local_e00 + -1;
              local_d30 = local_dfc;
              local_d34 = local_df8;
              local_d38 = local_df4;
              local_ce0 = local_14d0;
              local_ce4 = local_e00;
              local_ce8 = local_dfc;
              local_cec = local_df8;
              local_cf0 = local_df4;
              local_14d0->p
              [(long)(local_e00 - (local_14d0->begin).x) +
               (long)(local_dfc - (local_14d0->begin).y) * local_14d0->jstride +
               (long)(local_df8 - (local_14d0->begin).z) * local_14d0->kstride +
               (long)local_df4 * local_14d0->nstride] =
                   -local_17c8 *
                   local_1448.p
                   [(long)(local_e00 - local_1448.begin.x) +
                    (local_dfc - local_1448.begin.y) * local_1448.jstride +
                    (local_df8 - local_1448.begin.z) * local_1448.kstride +
                    local_df4 * local_1448.nstride] *
                   (local_15a8->p
                    [(long)(local_e00 - (local_15a8->begin).x) +
                     (long)(local_dfc - (local_15a8->begin).y) * local_15a8->jstride +
                     (long)(local_df8 - (local_15a8->begin).z) * local_15a8->kstride +
                     (long)local_df4 * local_15a8->nstride] -
                   local_15a8->p
                   [(long)(local_d2c - (local_15a8->begin).x) +
                    (long)(local_dfc - (local_15a8->begin).y) * local_15a8->jstride +
                    (long)(local_df8 - (local_15a8->begin).z) * local_15a8->kstride +
                    (long)local_df4 * local_15a8->nstride]);
              local_cf8 = local_da8;
              iVar1 = local_e00 + 1;
            }
            iVar1 = local_dfc + 1;
          }
          iVar1 = local_df8 + 1;
        }
      }
      local_d90 = &local_1864;
      local_d78 = &local_1864;
      local_d50 = &local_1864;
      local_930 = &local_1864;
      local_920 = &local_1864;
      local_910 = &local_1864;
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_1830);
    }
    local_17c8 = local_13e8 * local_13e0[1];
    local_e18 = local_13d8;
    local_e1c = 1;
    local_1880 = *(undefined8 *)(local_13d8->smallend).vect;
    local_1878 = *(undefined8 *)((local_13d8->smallend).vect + 2);
    local_1870 = *(undefined8 *)((local_13d8->bigend).vect + 1);
    local_1868 = (local_13d8->btype).itype;
    local_730 = &local_1880;
    local_734 = 1;
    local_720 = &local_1868;
    local_724 = 1;
    local_704 = 1;
    local_6f8 = 1;
    if ((local_1868 & 2) == 0) {
      local_710 = (long)&local_1878 + 4;
      local_714 = 1;
      local_718 = 1;
      local_6f0 = &local_1868;
      local_6f4 = 1;
      local_6e8 = 1;
      local_1868 = local_1868 | 2;
    }
    local_17cc = local_1868;
    local_17e4 = local_1880;
    local_17dc = local_1878;
    local_17d4 = local_1870;
    local_700 = local_720;
    Gpu::Range<amrex::Box>(&in_stack_ffffffffffffe5f0->m_b);
    local_1888 = local_18b0;
    Gpu::range_detail::range_impl<amrex::Box>::begin(in_stack_ffffffffffffe5f0);
    Gpu::range_detail::range_impl<amrex::Box>::end(in_stack_ffffffffffffe5f0);
    while (bVar3 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                             (&local_18c8,&local_18e0), bVar3) {
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_18fc,&local_18c8);
      local_c70 = local_1518;
      local_c78 = local_15a8;
      local_c80 = &local_1488;
      local_c88 = local_17c8;
      local_c8c = in_stack_00000008;
      local_974 = 0;
      local_984 = 1;
      local_994 = 2;
      local_9a0 = &local_18fc.bigend;
      local_9a4 = 0;
      local_9b0 = &local_18fc.bigend;
      local_9b4 = 1;
      local_9c0 = &local_18fc.bigend;
      local_9c4 = 2;
      for (local_ccc = 0; iVar1 = local_18fc.smallend.vect[2], local_ccc < in_stack_00000008;
          local_ccc = local_ccc + 1) {
        while (local_cd0 = iVar1, iVar1 = local_18fc.smallend.vect[1],
              local_cd0 <= local_18fc.bigend.vect[2]) {
          while (local_cd4 = iVar1, iVar1 = local_18fc.smallend.vect[0],
                local_cd4 <= local_18fc.bigend.vect[1]) {
            while (local_cd8 = iVar1, local_cd8 <= local_18fc.bigend.vect[0]) {
              local_bd4 = local_cd8;
              local_bd8 = local_cd4;
              local_bdc = local_cd0;
              local_be0 = local_ccc;
              local_be8 = local_15a8;
              local_bec = local_cd8;
              local_bf0 = local_cd4;
              local_bf4 = local_cd0;
              local_bf8 = local_ccc;
              local_c00 = local_15a8;
              local_c04 = local_cd8;
              local_c08 = local_cd4 + -1;
              local_c0c = local_cd0;
              local_c10 = local_ccc;
              local_bb8 = local_1518;
              local_bbc = local_cd8;
              local_bc0 = local_cd4;
              local_bc4 = local_cd0;
              local_bc8 = local_ccc;
              local_1518->p
              [(long)(local_cd8 - (local_1518->begin).x) +
               (long)(local_cd4 - (local_1518->begin).y) * local_1518->jstride +
               (long)(local_cd0 - (local_1518->begin).z) * local_1518->kstride +
               (long)local_ccc * local_1518->nstride] =
                   -local_17c8 *
                   local_1488.p
                   [(long)(local_cd8 - local_1488.begin.x) +
                    (local_cd4 - local_1488.begin.y) * local_1488.jstride +
                    (local_cd0 - local_1488.begin.z) * local_1488.kstride +
                    local_ccc * local_1488.nstride] *
                   (local_15a8->p
                    [(long)(local_cd8 - (local_15a8->begin).x) +
                     (long)(local_cd4 - (local_15a8->begin).y) * local_15a8->jstride +
                     (long)(local_cd0 - (local_15a8->begin).z) * local_15a8->kstride +
                     (long)local_ccc * local_15a8->nstride] -
                   local_15a8->p
                   [(long)(local_cd8 - (local_15a8->begin).x) +
                    (long)(local_c08 - (local_15a8->begin).y) * local_15a8->jstride +
                    (long)(local_cd0 - (local_15a8->begin).z) * local_15a8->kstride +
                    (long)local_ccc * local_15a8->nstride]);
              local_bd0 = local_c80;
              iVar1 = local_cd8 + 1;
            }
            iVar1 = local_cd4 + 1;
          }
          iVar1 = local_cd0 + 1;
        }
      }
      local_c68 = &local_18fc;
      local_c50 = &local_18fc;
      local_c28 = &local_18fc;
      local_990 = &local_18fc;
      local_980 = &local_18fc;
      local_970 = &local_18fc;
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_18c8);
    }
    local_17c8 = local_13e8 * local_13e0[2];
    local_e28 = local_13d8;
    local_e2c = 2;
    local_1918 = *(undefined8 *)(local_13d8->smallend).vect;
    local_1910 = *(undefined8 *)((local_13d8->smallend).vect + 2);
    local_1908 = *(undefined8 *)((local_13d8->bigend).vect + 1);
    local_1900 = (local_13d8->btype).itype;
    local_6e0 = &local_1918;
    local_6e4 = 2;
    local_6d0 = &local_1900;
    local_6d4 = 2;
    local_6b4 = 2;
    local_6a8 = 2;
    if ((local_1900 & 4) == 0) {
      local_6c0 = (long)&local_1910 + 4;
      local_6c4 = 2;
      local_6c8 = 1;
      local_6a0 = &local_1900;
      local_6a4 = 2;
      local_694 = 2;
      local_1900 = local_1900 | 4;
    }
    local_17cc = local_1900;
    local_17e4 = local_1918;
    local_17dc = local_1910;
    local_17d4 = local_1908;
    local_6b0 = local_6d0;
    Gpu::Range<amrex::Box>(&in_stack_ffffffffffffe5f0->m_b);
    local_1920 = local_1948;
    Gpu::range_detail::range_impl<amrex::Box>::begin(in_stack_ffffffffffffe5f0);
    Gpu::range_detail::range_impl<amrex::Box>::end(in_stack_ffffffffffffe5f0);
    while (bVar3 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                             (&local_1960,&local_1978), bVar3) {
      __return_storage_ptr__ = &local_1994;
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*
                (__return_storage_ptr__,&local_1960);
      local_b48 = local_1560;
      local_b50 = local_15a8;
      local_b58 = &local_14c8;
      local_b60 = local_17c8;
      local_b64 = in_stack_00000008;
      local_9d4 = 0;
      local_b1c = (__return_storage_ptr__->smallend).vect[0];
      local_9e4 = 1;
      iStack_b18 = (__return_storage_ptr__->smallend).vect[1];
      local_b80 = *(undefined8 *)(__return_storage_ptr__->smallend).vect;
      local_9f4 = 2;
      local_b78 = (__return_storage_ptr__->smallend).vect[2];
      local_a00 = &__return_storage_ptr__->bigend;
      local_a04 = 0;
      local_af4 = local_a00->vect[0];
      local_a10 = &__return_storage_ptr__->bigend;
      local_a14 = 1;
      iStack_af0 = (__return_storage_ptr__->bigend).vect[1];
      local_ba0 = *(undefined8 *)local_a00->vect;
      local_a20 = &__return_storage_ptr__->bigend;
      local_a24 = 2;
      local_b98 = (__return_storage_ptr__->bigend).vect[2];
      for (local_ba4 = 0; iVar1 = local_b78, local_ba4 < in_stack_00000008;
          local_ba4 = local_ba4 + 1) {
        while (local_ba8 = iVar1, iVar1 = iStack_b18, local_ba8 <= local_b98) {
          while (local_bac = iVar1, iVar1 = local_b1c, local_bac <= iStack_af0) {
            while (local_bb0 = iVar1, local_bb0 <= local_af4) {
              local_aac = local_bb0;
              local_ab0 = local_bac;
              local_ab4 = local_ba8;
              local_ab8 = local_ba4;
              local_ac0 = local_15a8;
              local_ac4 = local_bb0;
              local_ac8 = local_bac;
              local_acc = local_ba8;
              local_ad0 = local_ba4;
              local_ad8 = local_15a8;
              local_adc = local_bb0;
              local_ae0 = local_bac;
              local_ae4 = local_ba8 + -1;
              local_ae8 = local_ba4;
              local_a90 = local_1560;
              local_a94 = local_bb0;
              local_a98 = local_bac;
              local_a9c = local_ba8;
              local_aa0 = local_ba4;
              local_1560->p
              [(long)(local_bb0 - (local_1560->begin).x) +
               (long)(local_bac - (local_1560->begin).y) * local_1560->jstride +
               (long)(local_ba8 - (local_1560->begin).z) * local_1560->kstride +
               (long)local_ba4 * local_1560->nstride] =
                   -local_17c8 *
                   local_14c8.p
                   [(long)(local_bb0 - local_14c8.begin.x) +
                    (local_bac - local_14c8.begin.y) * local_14c8.jstride +
                    (local_ba8 - local_14c8.begin.z) * local_14c8.kstride +
                    local_ba4 * local_14c8.nstride] *
                   (local_15a8->p
                    [(long)(local_bb0 - (local_15a8->begin).x) +
                     (long)(local_bac - (local_15a8->begin).y) * local_15a8->jstride +
                     (long)(local_ba8 - (local_15a8->begin).z) * local_15a8->kstride +
                     (long)local_ba4 * local_15a8->nstride] -
                   local_15a8->p
                   [(long)(local_bb0 - (local_15a8->begin).x) +
                    (long)(local_bac - (local_15a8->begin).y) * local_15a8->jstride +
                    (long)(local_ae4 - (local_15a8->begin).z) * local_15a8->kstride +
                    (long)local_ba4 * local_15a8->nstride]);
              local_aa8 = local_b58;
              iVar1 = local_bb0 + 1;
            }
            iVar1 = local_bac + 1;
          }
          iVar1 = local_ba8 + 1;
        }
      }
      local_b8c = local_ba0;
      local_b84 = local_b98;
      local_b70 = local_b80;
      local_b68 = local_b78;
      local_b40 = __return_storage_ptr__;
      local_b38 = local_b80;
      local_b30 = local_b78;
      local_b28 = __return_storage_ptr__;
      local_b14 = local_b78;
      local_b10 = local_ba0;
      local_b08 = local_b98;
      local_b00 = __return_storage_ptr__;
      local_aec = local_b98;
      local_9f0 = __return_storage_ptr__;
      local_9e0 = __return_storage_ptr__;
      local_9d0 = __return_storage_ptr__;
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_1960);
    }
  }
  else {
    local_15f0 = local_13e8 * *local_13e0;
    local_12f8 = local_13d8;
    local_12fc = 0;
    local_1300 = 1;
    pIVar7 = Box::smallEnd(local_13d8);
    local_130c.vect._0_8_ = *(undefined8 *)pIVar7->vect;
    local_130c.vect[2] = pIVar7->vect[2];
    pIVar7 = Box::bigEnd(local_12f8);
    uVar2 = *(undefined8 *)pIVar7->vect;
    iVar1 = pIVar7->vect[2];
    local_a54 = local_12fc;
    local_131c = local_130c.vect[local_12fc];
    iVar4 = (local_131c - local_1300) + 1;
    local_7d4 = local_12fc;
    local_130c.vect[local_12fc] = iVar4;
    local_7e4 = local_12fc;
    local_1318.vect[local_12fc] = local_131c;
    local_1318.vect._0_8_ = uVar2;
    local_1318.vect[2] = iVar1;
    local_a50 = &local_130c;
    local_7e8 = local_131c;
    local_7e0 = &local_1318;
    local_7d8 = iVar4;
    local_7d0 = &local_130c;
    local_1324 = (uint)Box::ixType(local_12f8);
    local_a80 = &local_1320;
    local_a84 = local_12fc;
    local_a78 = local_12fc;
    local_1324 = 1 << ((byte)local_12fc & 0x1f) | local_1324;
    local_1320 = local_1324;
    Box::Box(&local_160c,&local_130c,&local_1318,(IndexType)local_1324);
    local_1610 = Box::length(local_13d8,0);
    Gpu::Range<amrex::Box>(&in_stack_ffffffffffffe5f0->m_b);
    local_1618 = local_1640;
    Gpu::range_detail::range_impl<amrex::Box>::begin(in_stack_ffffffffffffe5f0);
    Gpu::range_detail::range_impl<amrex::Box>::end(in_stack_ffffffffffffe5f0);
    while (bVar3 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                             (&local_1658,&local_1670), bVar3) {
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_168c,&local_1658);
      local_1280 = local_14d0;
      local_1288 = local_15a8;
      local_1290 = &local_1448;
      local_1298 = local_15f0;
      local_129c = local_1610;
      local_12a0 = in_stack_00000008;
      local_7f4 = 0;
      local_804 = 1;
      local_814 = 2;
      local_820 = &local_168c.bigend;
      local_824 = 0;
      local_830 = &local_168c.bigend;
      local_834 = 1;
      local_840 = &local_168c.bigend;
      local_844 = 2;
      for (local_12e4 = 0; iVar1 = local_168c.smallend.vect[2], local_12e4 < in_stack_00000008;
          local_12e4 = local_12e4 + 1) {
        while (local_12e8 = iVar1, iVar1 = local_168c.smallend.vect[1],
              local_12e8 <= local_168c.bigend.vect[2]) {
          while (local_12ec = iVar1, local_12ec <= local_168c.bigend.vect[1]) {
            local_11a0 = local_12ec;
            local_11a4 = local_12e8;
            local_11a8 = local_12e4;
            local_11b0 = local_15a8;
            local_11b8 = local_12ec;
            local_11bc = local_12e8;
            local_11c0 = local_12e4;
            local_11c8 = local_15a8;
            local_11cc = local_168c.smallend.vect[0] + -1;
            local_11d0 = local_12ec;
            local_11d4 = local_12e8;
            local_11d8 = local_12e4;
            local_1168 = local_14d0;
            local_1170 = local_12ec;
            local_1174 = local_12e8;
            local_1178 = local_12e4;
            local_14d0->p
            [(long)(local_168c.smallend.vect[0] - (local_14d0->begin).x) +
             (long)(local_12ec - (local_14d0->begin).y) * local_14d0->jstride +
             (long)(local_12e8 - (local_14d0->begin).z) * local_14d0->kstride +
             (long)local_12e4 * local_14d0->nstride] =
                 -local_15f0 *
                 local_1448.p
                 [(long)(local_168c.smallend.vect[0] - local_1448.begin.x) +
                  (local_12ec - local_1448.begin.y) * local_1448.jstride +
                  (local_12e8 - local_1448.begin.z) * local_1448.kstride +
                  local_12e4 * local_1448.nstride] *
                 (local_15a8->p
                  [(long)(local_168c.smallend.vect[0] - (local_15a8->begin).x) +
                   (long)(local_12ec - (local_15a8->begin).y) * local_15a8->jstride +
                   (long)(local_12e8 - (local_15a8->begin).z) * local_15a8->kstride +
                   (long)local_12e4 * local_15a8->nstride] -
                 local_15a8->p
                 [(long)(local_11cc - (local_15a8->begin).x) +
                  (long)(local_12ec - (local_15a8->begin).y) * local_15a8->jstride +
                  (long)(local_12e8 - (local_15a8->begin).z) * local_15a8->kstride +
                  (long)local_12e4 * local_15a8->nstride]);
            local_12f0 = local_1610 + local_168c.smallend.vect[0];
            local_11e8 = local_12ec;
            local_11ec = local_12e8;
            local_11f0 = local_12e4;
            local_11f8 = local_15a8;
            local_1200 = local_12ec;
            local_1204 = local_12e8;
            local_1208 = local_12e4;
            local_1210 = local_15a8;
            local_1214 = local_12f0 + -1;
            local_1218 = local_12ec;
            local_121c = local_12e8;
            local_1220 = local_12e4;
            local_1180 = local_14d0;
            local_1188 = local_12ec;
            local_118c = local_12e8;
            local_1190 = local_12e4;
            local_14d0->p
            [(long)(local_12f0 - (local_14d0->begin).x) +
             (long)(local_12ec - (local_14d0->begin).y) * local_14d0->jstride +
             (long)(local_12e8 - (local_14d0->begin).z) * local_14d0->kstride +
             (long)local_12e4 * local_14d0->nstride] =
                 -local_15f0 *
                 local_1448.p
                 [(long)(local_12f0 - local_1448.begin.x) +
                  (local_12ec - local_1448.begin.y) * local_1448.jstride +
                  (local_12e8 - local_1448.begin.z) * local_1448.kstride +
                  local_12e4 * local_1448.nstride] *
                 (local_15a8->p
                  [(long)(local_12f0 - (local_15a8->begin).x) +
                   (long)(local_12ec - (local_15a8->begin).y) * local_15a8->jstride +
                   (long)(local_12e8 - (local_15a8->begin).z) * local_15a8->kstride +
                   (long)local_12e4 * local_15a8->nstride] -
                 local_15a8->p
                 [(long)(local_1214 - (local_15a8->begin).x) +
                  (long)(local_12ec - (local_15a8->begin).y) * local_15a8->jstride +
                  (long)(local_12e8 - (local_15a8->begin).z) * local_15a8->kstride +
                  (long)local_12e4 * local_15a8->nstride]);
            local_11fc = local_12f0;
            local_11e4 = local_12f0;
            local_11e0 = local_1290;
            local_1198 = local_1290;
            local_1184 = local_12f0;
            iVar1 = local_12ec + 1;
          }
          iVar1 = local_12e8 + 1;
        }
      }
      local_1278 = &local_168c;
      local_1260 = &local_168c;
      local_1238 = &local_168c;
      local_810 = &local_168c;
      local_800 = &local_168c;
      local_7f0 = &local_168c;
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_1658);
    }
    local_15f0 = local_13e8 * local_13e0[1];
    local_1330 = local_13d8;
    local_1334 = 1;
    local_1338 = 1;
    pIVar7 = Box::smallEnd(local_13d8);
    local_1344.vect._0_8_ = *(undefined8 *)pIVar7->vect;
    local_1344.vect[2] = pIVar7->vect[2];
    pIVar7 = Box::bigEnd(local_1330);
    uVar2 = *(undefined8 *)pIVar7->vect;
    iVar1 = pIVar7->vect[2];
    local_a44 = local_1334;
    local_1354 = local_1344.vect[local_1334];
    iVar4 = (local_1354 - local_1338) + 1;
    local_7b4 = local_1334;
    local_1344.vect[local_1334] = iVar4;
    local_7c4 = local_1334;
    local_1350.vect[local_1334] = local_1354;
    local_1350.vect._0_8_ = uVar2;
    local_1350.vect[2] = iVar1;
    local_a40 = &local_1344;
    local_7c8 = local_1354;
    local_7c0 = &local_1350;
    local_7b8 = iVar4;
    local_7b0 = &local_1344;
    local_135c = (uint)Box::ixType(local_1330);
    local_a70 = &local_1358;
    local_a74 = local_1334;
    local_a68 = local_1334;
    local_135c = 1 << ((byte)local_1334 & 0x1f) | local_135c;
    local_1358 = local_135c;
    Box::Box(&local_16a8,&local_1344,&local_1350,(IndexType)local_135c);
    local_160c.smallend.vect[0] = local_16a8.smallend.vect[0];
    local_160c.smallend.vect[1] = local_16a8.smallend.vect[1];
    local_160c.smallend.vect[2] = local_16a8.smallend.vect[2];
    local_160c.bigend.vect[0] = local_16a8.bigend.vect[0];
    local_160c.bigend.vect[1] = local_16a8.bigend.vect[1];
    local_160c.bigend.vect[2] = local_16a8.bigend.vect[2];
    local_160c.btype.itype = local_16a8.btype.itype;
    local_1610 = Box::length(local_13d8,1);
    Gpu::Range<amrex::Box>(&in_stack_ffffffffffffe5f0->m_b);
    local_16b0 = local_16d8;
    Gpu::range_detail::range_impl<amrex::Box>::begin(in_stack_ffffffffffffe5f0);
    Gpu::range_detail::range_impl<amrex::Box>::end(in_stack_ffffffffffffe5f0);
    while (bVar3 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                             (&local_16f0,&local_1708), bVar3) {
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_1724,&local_16f0);
      local_10e8 = local_1518;
      local_10f0 = local_15a8;
      local_10f8 = &local_1488;
      local_1100 = local_15f0;
      local_1104 = local_1610;
      local_1108 = in_stack_00000008;
      local_854 = 0;
      local_864 = 1;
      local_874 = 2;
      local_880 = &local_1724.bigend;
      local_884 = 0;
      local_890 = &local_1724.bigend;
      local_894 = 1;
      local_8a0 = &local_1724.bigend;
      local_8a4 = 2;
      for (local_114c = 0; iVar1 = local_1724.smallend.vect[2], local_114c < in_stack_00000008;
          local_114c = local_114c + 1) {
        while (local_1150 = iVar1, iVar1 = local_1724.smallend.vect[0],
              local_1150 <= local_1724.bigend.vect[2]) {
          while (local_1158 = iVar1, local_1158 <= local_1724.bigend.vect[0]) {
            local_1004 = local_1158;
            local_100c = local_1150;
            local_1010 = local_114c;
            local_1018 = local_15a8;
            local_101c = local_1158;
            local_1024 = local_1150;
            local_1028 = local_114c;
            local_1030 = local_15a8;
            local_1034 = local_1158;
            local_1038 = local_1724.smallend.vect[1] + -1;
            local_103c = local_1150;
            local_1040 = local_114c;
            local_fd0 = local_1518;
            local_fd4 = local_1158;
            local_fdc = local_1150;
            local_fe0 = local_114c;
            local_1518->p
            [(long)(local_1158 - (local_1518->begin).x) +
             (long)(local_1724.smallend.vect[1] - (local_1518->begin).y) * local_1518->jstride +
             (long)(local_1150 - (local_1518->begin).z) * local_1518->kstride +
             (long)local_114c * local_1518->nstride] =
                 -local_15f0 *
                 local_1488.p
                 [(long)(local_1158 - local_1488.begin.x) +
                  (local_1724.smallend.vect[1] - local_1488.begin.y) * local_1488.jstride +
                  (local_1150 - local_1488.begin.z) * local_1488.kstride +
                  local_114c * local_1488.nstride] *
                 (local_15a8->p
                  [(long)(local_1158 - (local_15a8->begin).x) +
                   (long)(local_1724.smallend.vect[1] - (local_15a8->begin).y) * local_15a8->jstride
                   + (long)(local_1150 - (local_15a8->begin).z) * local_15a8->kstride +
                   (long)local_114c * local_15a8->nstride] -
                 local_15a8->p
                 [(long)(local_1158 - (local_15a8->begin).x) +
                  (long)(local_1038 - (local_15a8->begin).y) * local_15a8->jstride +
                  (long)(local_1150 - (local_15a8->begin).z) * local_15a8->kstride +
                  (long)local_114c * local_15a8->nstride]);
            local_1000 = local_10f8;
            iVar1 = local_1158 + 1;
          }
          local_1154 = local_1610 + local_1724.smallend.vect[1];
          for (local_115c = local_1724.smallend.vect[0]; local_115c <= local_1724.bigend.vect[0];
              local_115c = local_115c + 1) {
            local_104c = local_115c;
            local_1054 = local_1150;
            local_1058 = local_114c;
            local_1060 = local_15a8;
            local_1064 = local_115c;
            local_106c = local_1150;
            local_1070 = local_114c;
            local_1078 = local_15a8;
            local_107c = local_115c;
            local_1080 = local_1154 + -1;
            local_1084 = local_1150;
            local_1088 = local_114c;
            local_fe8 = local_1518;
            local_fec = local_115c;
            local_ff4 = local_1150;
            local_ff8 = local_114c;
            local_1518->p
            [(long)(local_115c - (local_1518->begin).x) +
             (long)(local_1154 - (local_1518->begin).y) * local_1518->jstride +
             (long)(local_1150 - (local_1518->begin).z) * local_1518->kstride +
             (long)local_114c * local_1518->nstride] =
                 -local_15f0 *
                 local_1488.p
                 [(long)(local_115c - local_1488.begin.x) +
                  (local_1154 - local_1488.begin.y) * local_1488.jstride +
                  (local_1150 - local_1488.begin.z) * local_1488.kstride +
                  local_114c * local_1488.nstride] *
                 (local_15a8->p
                  [(long)(local_115c - (local_15a8->begin).x) +
                   (long)(local_1154 - (local_15a8->begin).y) * local_15a8->jstride +
                   (long)(local_1150 - (local_15a8->begin).z) * local_15a8->kstride +
                   (long)local_114c * local_15a8->nstride] -
                 local_15a8->p
                 [(long)(local_115c - (local_15a8->begin).x) +
                  (long)(local_1080 - (local_15a8->begin).y) * local_15a8->jstride +
                  (long)(local_1150 - (local_15a8->begin).z) * local_15a8->kstride +
                  (long)local_114c * local_15a8->nstride]);
            local_1068 = local_1154;
            local_1050 = local_1154;
            local_1048 = local_10f8;
            local_ff0 = local_1154;
          }
          iVar1 = local_1150 + 1;
        }
      }
      local_10e0 = &local_1724;
      local_10c8 = &local_1724;
      local_10a0 = &local_1724;
      local_870 = &local_1724;
      local_860 = &local_1724;
      local_850 = &local_1724;
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_16f0);
    }
    local_15f0 = local_13e8 * local_13e0[2];
    local_1368 = local_13d8;
    local_136c = 2;
    local_1370 = 1;
    pIVar7 = Box::smallEnd(local_13d8);
    local_137c.vect._0_8_ = *(undefined8 *)pIVar7->vect;
    local_137c.vect[2] = pIVar7->vect[2];
    pIVar7 = Box::bigEnd(local_1368);
    uVar2 = *(undefined8 *)pIVar7->vect;
    iVar1 = pIVar7->vect[2];
    local_a34 = local_136c;
    local_138c = local_137c.vect[local_136c];
    iVar4 = (local_138c - local_1370) + 1;
    local_794 = local_136c;
    local_137c.vect[local_136c] = iVar4;
    local_7a4 = local_136c;
    local_1388.vect[local_136c] = local_138c;
    local_1388.vect._0_8_ = uVar2;
    local_1388.vect[2] = iVar1;
    local_a30 = &local_137c;
    local_7a8 = local_138c;
    local_7a0 = &local_1388;
    local_798 = iVar4;
    local_790 = &local_137c;
    local_1394 = (uint)Box::ixType(local_1368);
    local_a60 = &local_1390;
    local_a64 = local_136c;
    local_a58 = local_136c;
    local_1394 = 1 << ((byte)local_136c & 0x1f) | local_1394;
    local_1390 = local_1394;
    Box::Box(&local_1740,&local_137c,&local_1388,(IndexType)local_1394);
    local_160c.smallend.vect[0] = local_1740.smallend.vect[0];
    local_160c.smallend.vect[1] = local_1740.smallend.vect[1];
    local_160c.smallend.vect[2] = local_1740.smallend.vect[2];
    local_160c.bigend.vect[0] = local_1740.bigend.vect[0];
    local_160c.bigend.vect[1] = local_1740.bigend.vect[1];
    local_160c.bigend.vect[2] = local_1740.bigend.vect[2];
    local_160c.btype.itype = local_1740.btype.itype;
    local_1610 = Box::length(local_13d8,2);
    Gpu::Range<amrex::Box>(&in_stack_ffffffffffffe5f0->m_b);
    local_1748 = local_1770;
    Gpu::range_detail::range_impl<amrex::Box>::begin(in_stack_ffffffffffffe5f0);
    Gpu::range_detail::range_impl<amrex::Box>::end(in_stack_ffffffffffffe5f0);
    while (bVar3 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                             (&local_1788,&local_17a0), bVar3) {
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_17bc,&local_1788);
      local_f50 = local_1560;
      local_f58 = local_15a8;
      local_f60 = &local_14c8;
      local_f68 = local_15f0;
      local_f6c = local_1610;
      local_f70 = in_stack_00000008;
      local_8b4 = 0;
      local_8c4 = 1;
      local_8d4 = 2;
      local_8e0 = &local_17bc.bigend;
      local_8e4 = 0;
      local_8f0 = &local_17bc.bigend;
      local_8f4 = 1;
      local_900 = &local_17bc.bigend;
      local_904 = 2;
      for (local_fb4 = 0; iVar1 = local_17bc.smallend.vect[1], local_fb4 < in_stack_00000008;
          local_fb4 = local_fb4 + 1) {
        while (local_fbc = iVar1, iVar1 = local_17bc.smallend.vect[0],
              local_fbc <= local_17bc.bigend.vect[1]) {
          while (local_fc0 = iVar1, local_fc0 <= local_17bc.bigend.vect[0]) {
            local_e6c = local_fc0;
            local_e70 = local_fbc;
            local_e78 = local_fb4;
            local_e80 = local_15a8;
            local_e84 = local_fc0;
            local_e88 = local_fbc;
            local_e90 = local_fb4;
            local_e98 = local_15a8;
            local_e9c = local_fc0;
            local_ea0 = local_fbc;
            local_ea4 = local_17bc.smallend.vect[2] + -1;
            local_ea8 = local_fb4;
            local_e38 = local_1560;
            local_e3c = local_fc0;
            local_e40 = local_fbc;
            local_e48 = local_fb4;
            local_1560->p
            [(long)(local_fc0 - (local_1560->begin).x) +
             (long)(local_fbc - (local_1560->begin).y) * local_1560->jstride +
             (long)(local_17bc.smallend.vect[2] - (local_1560->begin).z) * local_1560->kstride +
             (long)local_fb4 * local_1560->nstride] =
                 -local_15f0 *
                 local_14c8.p
                 [(long)(local_fc0 - local_14c8.begin.x) +
                  (local_fbc - local_14c8.begin.y) * local_14c8.jstride +
                  (local_17bc.smallend.vect[2] - local_14c8.begin.z) * local_14c8.kstride +
                  local_fb4 * local_14c8.nstride] *
                 (local_15a8->p
                  [(long)(local_fc0 - (local_15a8->begin).x) +
                   (long)(local_fbc - (local_15a8->begin).y) * local_15a8->jstride +
                   (long)(local_17bc.smallend.vect[2] - (local_15a8->begin).z) * local_15a8->kstride
                   + (long)local_fb4 * local_15a8->nstride] -
                 local_15a8->p
                 [(long)(local_fc0 - (local_15a8->begin).x) +
                  (long)(local_fbc - (local_15a8->begin).y) * local_15a8->jstride +
                  (long)(local_ea4 - (local_15a8->begin).z) * local_15a8->kstride +
                  (long)local_fb4 * local_15a8->nstride]);
            local_e68 = local_f60;
            iVar1 = local_fc0 + 1;
          }
          iVar1 = local_fbc + 1;
        }
        local_fb8 = local_1610 + local_17bc.smallend.vect[2];
        for (local_fc4 = local_17bc.smallend.vect[1]; iVar1 = local_17bc.smallend.vect[0],
            local_fc4 <= local_17bc.bigend.vect[1]; local_fc4 = local_fc4 + 1) {
          while (local_fc8 = iVar1, local_fc8 <= local_17bc.bigend.vect[0]) {
            local_eb4 = local_fc8;
            local_eb8 = local_fc4;
            local_ec0 = local_fb4;
            local_ec8 = local_15a8;
            local_ecc = local_fc8;
            local_ed0 = local_fc4;
            local_ed8 = local_fb4;
            local_ee0 = local_15a8;
            local_ee4 = local_fc8;
            local_ee8 = local_fc4;
            local_eec = local_fb8 + -1;
            local_ef0 = local_fb4;
            local_e50 = local_1560;
            local_e54 = local_fc8;
            local_e58 = local_fc4;
            local_e60 = local_fb4;
            local_1560->p
            [(long)(local_fc8 - (local_1560->begin).x) +
             (long)(local_fc4 - (local_1560->begin).y) * local_1560->jstride +
             (long)(local_fb8 - (local_1560->begin).z) * local_1560->kstride +
             (long)local_fb4 * local_1560->nstride] =
                 -local_15f0 *
                 local_14c8.p
                 [(long)(local_fc8 - local_14c8.begin.x) +
                  (local_fc4 - local_14c8.begin.y) * local_14c8.jstride +
                  (local_fb8 - local_14c8.begin.z) * local_14c8.kstride +
                  local_fb4 * local_14c8.nstride] *
                 (local_15a8->p
                  [(long)(local_fc8 - (local_15a8->begin).x) +
                   (long)(local_fc4 - (local_15a8->begin).y) * local_15a8->jstride +
                   (long)(local_fb8 - (local_15a8->begin).z) * local_15a8->kstride +
                   (long)local_fb4 * local_15a8->nstride] -
                 local_15a8->p
                 [(long)(local_fc8 - (local_15a8->begin).x) +
                  (long)(local_fc4 - (local_15a8->begin).y) * local_15a8->jstride +
                  (long)(local_eec - (local_15a8->begin).z) * local_15a8->kstride +
                  (long)local_fb4 * local_15a8->nstride]);
            local_ed4 = local_fb8;
            local_ebc = local_fb8;
            local_eb0 = local_f60;
            local_e5c = local_fb8;
            iVar1 = local_fc8 + 1;
          }
        }
      }
      local_f48 = &local_17bc;
      local_f30 = &local_17bc;
      local_f08 = &local_17bc;
      local_8d0 = &local_17bc;
      local_8c0 = &local_17bc;
      local_8b0 = &local_17bc;
      Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_1788);
    }
  }
  return;
}

Assistant:

void
MLABecLaplacian::FFlux (Box const& box, Real const* dxinv, Real bscalar,
                        Array<FArrayBox const*, AMREX_SPACEDIM> const& bcoef,
                        Array<FArrayBox*,AMREX_SPACEDIM> const& flux,
                        FArrayBox const& sol, int face_only, int ncomp)
{
    AMREX_D_TERM(const auto bx = bcoef[0]->const_array();,
                 const auto by = bcoef[1]->const_array();,
                 const auto bz = bcoef[2]->const_array(););
    AMREX_D_TERM(const auto& fxarr = flux[0]->array();,
                 const auto& fyarr = flux[1]->array();,
                 const auto& fzarr = flux[2]->array(););
    const auto& solarr = sol.array();

    if (face_only)
    {
        Real fac = bscalar*dxinv[0];
        Box blo = amrex::bdryLo(box, 0);
        int blen = box.length(0);
        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( blo, tbox,
        {
            mlabeclap_flux_xface(tbox, fxarr, solarr, bx, fac, blen, ncomp);
        });
#if (AMREX_SPACEDIM >= 2)
        fac = bscalar*dxinv[1];
        blo = amrex::bdryLo(box, 1);
        blen = box.length(1);
        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( blo, tbox,
        {
            mlabeclap_flux_yface(tbox, fyarr, solarr, by, fac, blen, ncomp);
        });
#endif
#if (AMREX_SPACEDIM == 3)
        fac = bscalar*dxinv[2];
        blo = amrex::bdryLo(box, 2);
        blen = box.length(2);
        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( blo, tbox,
        {
            mlabeclap_flux_zface(tbox, fzarr, solarr, bz, fac, blen, ncomp);
        });
#endif
    }
    else
    {
        Real fac = bscalar*dxinv[0];
        Box bflux = amrex::surroundingNodes(box, 0);
        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bflux, tbox,
        {
            mlabeclap_flux_x(tbox, fxarr, solarr, bx, fac, ncomp);
        });
#if (AMREX_SPACEDIM >= 2)
        fac = bscalar*dxinv[1];
        bflux = amrex::surroundingNodes(box, 1);
        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bflux, tbox,
        {
            mlabeclap_flux_y(tbox, fyarr, solarr, by, fac, ncomp);
        });
#endif
#if (AMREX_SPACEDIM == 3)
        fac = bscalar*dxinv[2];
        bflux = amrex::surroundingNodes(box, 2);
        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bflux, tbox,
        {
            mlabeclap_flux_z(tbox, fzarr, solarr, bz, fac, ncomp);
        });
#endif
    }
}